

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

FaceIter __thiscall CMU462::HalfedgeMesh::bevelFace(HalfedgeMesh *this,FaceIter f)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inward_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  outward_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  new_vertex;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  connectingEdge;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  innerEdge;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  sideFace;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_twin_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  old_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  old_vertex;
  _List_iterator<CMU462::Face> local_1a8;
  ulong local_1a0;
  Size local_198;
  _List_node_base *local_190;
  value_type local_188;
  ulong local_180;
  pointer local_178;
  pointer local_170;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_168;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_148;
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_128;
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_108;
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_e8;
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_c8;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_a8;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_88;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_68;
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_48;
  
  local_198 = Face::degree((Face *)(f._M_node + 1));
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._M_node = f._M_node[0xb]._M_prev;
  do {
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 *)&local_48,(value_type *)&local_188._M_node[2]._M_prev);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_68,&local_188);
    local_188._M_node = local_188._M_node[2]._M_next;
  } while (f._M_node[0xb]._M_prev != local_188._M_node);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0;
  if (0 < (int)local_198) {
    uVar6 = local_198 & 0xffffffff;
  }
  local_1a0 = CONCAT44(local_1a0._4_4_,(int)uVar6);
  while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
    local_1a8._M_node = (_List_node_base *)newFace(this);
    std::vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
    ::emplace_back<std::_List_iterator<CMU462::Face>>
              ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                *)&local_c8,&local_1a8);
    local_1a8._M_node = (_List_node_base *)newEdge(this);
    std::vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
    ::emplace_back<std::_List_iterator<CMU462::Edge>>
              ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                *)&local_e8,(_List_iterator<CMU462::Edge> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newEdge(this);
    std::vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
    ::emplace_back<std::_List_iterator<CMU462::Edge>>
              ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                *)&local_108,(_List_iterator<CMU462::Edge> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newVertex(this);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
    ::emplace_back<std::_List_iterator<CMU462::Vertex>>
              ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                *)&local_128,(_List_iterator<CMU462::Vertex> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newHalfedge(this);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_148,(_List_iterator<CMU462::Halfedge> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newHalfedge(this);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_168,(_List_iterator<CMU462::Halfedge> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newHalfedge(this);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_88,(_List_iterator<CMU462::Halfedge> *)&local_1a8);
    local_1a8._M_node = (_List_node_base *)newHalfedge(this);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_a8,(_List_iterator<CMU462::Halfedge> *)&local_1a8);
  }
  local_170 = local_e8._M_impl.super__Vector_impl_data._M_start;
  local_178 = local_108._M_impl.super__Vector_impl_data._M_start;
  local_1a0 = local_1a0 & 0xffffffff;
  iVar5 = (int)local_198;
  local_180 = (ulong)(iVar5 - 1U);
  uVar6 = 0;
  while (local_1a0 != uVar6) {
    uVar1 = uVar6 + 1;
    uVar8 = (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % (long)iVar5 &
            0xffffffff;
    iVar7 = (int)((iVar5 - 1U) + (int)uVar6) % iVar5;
    p_Var2 = local_48._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var3 = local_128._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var3[2]._M_prev = p_Var2[2]._M_prev;
    p_Var4 = p_Var2[2]._M_next;
    p_Var3[1]._M_prev = p_Var2[1]._M_prev;
    p_Var3[2]._M_next = p_Var4;
    p_Var2 = local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_48._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[0xf]._M_prev = p_Var2;
    p_Var2[2]._M_prev = local_48._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var2 = local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_128._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[0xf]._M_prev = p_Var2;
    p_Var2[2]._M_prev = local_128._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_prev =
         local_128._M_impl.super__Vector_impl_data._M_start[uVar8]._M_node;
    local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_prev =
         local_128._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var2 = local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[1]._M_prev = p_Var2;
    p_Var2[1]._M_prev = local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var2 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[1]._M_prev = p_Var2;
    p_Var2[1]._M_prev = local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_prev =
         local_c8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_prev =
         local_c8._M_impl.super__Vector_impl_data._M_start[iVar7]._M_node;
    p_Var2 = local_c8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_prev = p_Var2;
    local_68._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_prev = p_Var2;
    local_c8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[0xb]._M_prev =
         local_68._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_prev = f._M_node;
    p_Var2 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_next = p_Var2;
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_next = p_Var2;
    local_e8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[6]._M_prev =
         local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    p_Var2 = local_108._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_next = p_Var2;
    local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[3]._M_next = p_Var2;
    local_108._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[6]._M_prev =
         local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_68._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_next =
         local_168._M_impl.super__Vector_impl_data._M_start[uVar8]._M_node;
    local_168._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_next =
         local_a8._M_impl.super__Vector_impl_data._M_start[iVar7]._M_node;
    p_Var2 = local_148._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_next = p_Var2;
    p_Var2[2]._M_next = local_68._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node;
    local_88._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node[2]._M_next =
         local_88._M_impl.super__Vector_impl_data._M_start[uVar8]._M_node;
    uVar6 = uVar1;
  }
  f._M_node[0xb]._M_prev = (local_88._M_impl.super__Vector_impl_data._M_start)->_M_node;
  local_190 = f._M_node;
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_a8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_88);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_168);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_148);
  std::
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~_Vector_base(&local_128);
  std::
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Vector_base(&local_108);
  std::
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Vector_base(&local_e8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ::~_Vector_base(&local_c8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_68);
  std::
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~_Vector_base(&local_48);
  return (FaceIter)f._M_node;
}

Assistant:

FaceIter HalfedgeMesh::bevelFace(FaceIter f) {
	// TODO This method should replace the face f with an additional, inset face
	// (and ring of faces around it), corresponding to a bevel operation. It
	// should return the new face.  NOTE: This method is responsible for updating
	// the *connectivity* of the mesh only---it does not need to update the vertex
	// positions.  These positions will be updated in
	// HalfedgeMesh::bevelFaceComputeNewPositions (which you also have to
	// implement!)

	int n = f->degree();
	vector<VertexIter> old_vertex;
	vector<HalfedgeIter> old_halfedge;
	HalfedgeIter h = f->halfedge();
	do {
		old_vertex.push_back(h->vertex());
		old_halfedge.push_back(h);
		h = h->next();
	} while (h != f->halfedge());

	FaceIter new_face = f;
	vector<FaceIter> sideFace;
	vector<EdgeIter> innerEdge;
	vector<EdgeIter> connectingEdge;
	vector<VertexIter> new_vertex;
	vector<HalfedgeIter> outward_halfedge;
	vector<HalfedgeIter> inward_halfedge;
	vector<HalfedgeIter> inside_halfedge;
	vector<HalfedgeIter> inside_twin_halfedge;

	for (int i = 0; i < n; i++) {
		sideFace.push_back(newFace());
		innerEdge.push_back(newEdge());
		connectingEdge.push_back(newEdge());
		new_vertex.push_back(newVertex());
		outward_halfedge.push_back(newHalfedge());
		inward_halfedge.push_back(newHalfedge());
		inside_halfedge.push_back(newHalfedge());
		inside_twin_halfedge.push_back(newHalfedge());
	}

	int i_plus_1, i_minus_1;
	for (int i = 0; i < n; i++) {
		i_plus_1 = (i + 1) % n;
		i_minus_1 = (i - 1 + n) % n;

		new_vertex[i]->position = old_vertex[i]->position;

		old_vertex[i]->halfedge() = inward_halfedge[i];
		inward_halfedge[i]->vertex() = old_vertex[i];
		new_vertex[i]->halfedge() = outward_halfedge[i];
		outward_halfedge[i]->vertex() = new_vertex[i];
		inside_twin_halfedge[i]->vertex() = new_vertex[i_plus_1];
		inside_halfedge[i]->vertex() = new_vertex[i];

		outward_halfedge[i]->twin() = inward_halfedge[i];
		inward_halfedge[i]->twin() = outward_halfedge[i];
		inside_halfedge[i]->twin() = inside_twin_halfedge[i];
		inside_twin_halfedge[i]->twin() = inside_halfedge[i];
		
		outward_halfedge[i]->face() = sideFace[i];
		inward_halfedge[i]->face() = sideFace[i_minus_1];
		inside_twin_halfedge[i]->face() = sideFace[i];
		old_halfedge[i]->face() = sideFace[i];
		sideFace[i]->halfedge() = old_halfedge[i];
		inside_halfedge[i]->face() = new_face;
		
		inside_halfedge[i]->edge() = innerEdge[i];
		inside_twin_halfedge[i]->edge() = innerEdge[i];
		innerEdge[i]->halfedge() = inside_halfedge[i];

		outward_halfedge[i]->edge() = connectingEdge[i];
		inward_halfedge[i]->edge() = connectingEdge[i];
		connectingEdge[i]->halfedge() = inward_halfedge[i];

		old_halfedge[i]->next() = inward_halfedge[i_plus_1];
		inward_halfedge[i]->next() = inside_twin_halfedge[i_minus_1];
		inside_twin_halfedge[i]->next() = outward_halfedge[i];
		outward_halfedge[i]->next() = old_halfedge[i];
		inside_halfedge[i]->next() = inside_halfedge[i_plus_1];
	}
	new_face->halfedge() = inside_halfedge[0];
	//showError("bevelFace() not implemented.");
	return new_face;
}